

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.h
# Opt level: O2

bool __thiscall
libebml::EbmlSemanticContext::operator!=(EbmlSemanticContext *this,EbmlSemanticContext *aElt)

{
  if (((this->Size == aElt->Size) && (this->MyTable == aElt->MyTable)) &&
     (this->UpTable == aElt->UpTable)) {
    return this->MasterElt != aElt->MasterElt || this->GetGlobalContext != aElt->GetGlobalContext;
  }
  return true;
}

Assistant:

bool operator!=(const EbmlSemanticContext & aElt) const {
      return ((Size != aElt.Size) || (MyTable != aElt.MyTable) ||
        (UpTable != aElt.UpTable) || (GetGlobalContext != aElt.GetGlobalContext) |
        (MasterElt != aElt.MasterElt));
    }